

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_message.h
# Opt level: O0

FtpMessage * __thiscall fineftp::FtpMessage::str_abi_cxx11_(FtpMessage *this)

{
  int *in_RSI;
  __cxx11 local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  FtpMessage *this_local;
  
  this_local = this;
  std::__cxx11::to_string(local_78,*in_RSI);
  ::std::operator+(local_58,(char *)local_78);
  ::std::operator+(local_38,local_58);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)local_38);
  ::std::__cxx11::string::~string((string *)local_38);
  ::std::__cxx11::string::~string((string *)local_58);
  ::std::__cxx11::string::~string((string *)local_78);
  return this;
}

Assistant:

inline std::string str() const
    {
      return std::to_string(static_cast<int>(code_)) + " " + message_ + "\r\n";
    }